

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O3

char * blob_read_string(blob_reader *blob)

{
  uint8_t *__s;
  void *pvVar1;
  ulong uVar2;
  ulong __n;
  
  __s = blob->current;
  if (__s < blob->end) {
    __n = (long)blob->end - (long)__s;
    pvVar1 = memchr(__s,0,__n);
    if (pvVar1 != (void *)0x0) {
      if (blob->overrun == false) {
        uVar2 = (ulong)(((int)pvVar1 - (int)__s) + 1);
        if (uVar2 <= __n) {
          blob->current = __s + uVar2;
          return (char *)__s;
        }
        blob->overrun = true;
      }
      __assert_fail("ensure_can_read(blob, size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/blob.c"
                    ,0x169,"char *blob_read_string(struct blob_reader *)");
    }
  }
  blob->overrun = true;
  return (char *)0x0;
}

Assistant:

char *
blob_read_string(struct blob_reader *blob)
{
   int size;
   char *ret;
   uint8_t *nul;

   /* If we're already at the end, then this is an overrun. */
   if (blob->current >= blob->end) {
      blob->overrun = true;
      return NULL;
   }

   /* Similarly, if there is no zero byte in the data remaining in this blob,
    * we also consider that an overrun.
    */
   nul = memchr(blob->current, 0, blob->end - blob->current);

   if (nul == NULL) {
      blob->overrun = true;
      return NULL;
   }

   size = nul - blob->current + 1;

   assert(ensure_can_read(blob, size));

   ret = (char *) blob->current;

   blob->current += size;

   return ret;
}